

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rtreeCheckNode(RtreeCheck *pCheck,int iDepth,u8 *aParent,i64 iNode)

{
  RtreeCoord RVar1;
  RtreeCoord RVar2;
  i64 iNode_00;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  void *__src;
  ushort *puVar6;
  sqlite3_stmt *pStmt;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  u8 *p;
  long lVar10;
  u8 *p_00;
  RtreeCoord p2;
  RtreeCoord p1;
  RtreeCoord c2;
  RtreeCoord c1;
  u8 *local_68;
  int local_5c;
  ushort *local_58;
  i64 local_50;
  ushort *local_48;
  ulong local_40;
  u8 *local_38;
  
  if (pCheck->rc != 0) {
    return;
  }
  uVar9 = (ulong)(uint)iDepth;
  pStmt = pCheck->pGetNode;
  local_68 = aParent;
  if (pStmt == (sqlite3_stmt *)0x0) {
    pStmt = rtreeCheckPrepare(pCheck,"SELECT data FROM %Q.\'%q_node\' WHERE nodeno=?",pCheck->zDb,
                              pCheck->zTab);
    pCheck->pGetNode = pStmt;
    if (pCheck->rc != 0) {
      return;
    }
  }
  sqlite3_bind_int64(pStmt,1,iNode);
  iVar4 = sqlite3_step(pCheck->pGetNode);
  if (iVar4 == 100) {
    uVar5 = sqlite3_column_bytes(pCheck->pGetNode,0);
    __src = sqlite3_column_blob(pCheck->pGetNode,0);
    puVar6 = (ushort *)sqlite3_malloc64((long)(int)uVar5);
    if (puVar6 != (ushort *)0x0) {
      memcpy(puVar6,__src,(long)(int)uVar5);
      goto LAB_001af82c;
    }
    pCheck->rc = 7;
  }
  uVar5 = 0;
  puVar6 = (ushort *)0x0;
LAB_001af82c:
  rtreeCheckReset(pCheck,pCheck->pGetNode);
  if ((puVar6 == (ushort *)0x0) && (pCheck->rc == 0)) {
    rtreeCheckAppendMsg(pCheck,"Node %lld missing from database",iNode);
    return;
  }
  if (puVar6 == (ushort *)0x0) {
    return;
  }
  if ((int)uVar5 < 4) {
    rtreeCheckAppendMsg(pCheck,"Node %lld is too small (%d bytes)",iNode,(ulong)uVar5);
  }
  else if ((local_68 == (u8 *)0x0) &&
          (uVar3 = *puVar6 << 8 | *puVar6 >> 8, uVar9 = (ulong)uVar3, 0x28 < uVar3)) {
    rtreeCheckAppendMsg(pCheck,"Rtree depth out of range (%d)",uVar9);
  }
  else {
    uVar3 = puVar6[1] << 8 | puVar6[1] >> 8;
    uVar7 = (ulong)uVar3;
    if ((int)uVar5 < (int)((pCheck->nDim * 8 + 8) * (uint)uVar3 | 4)) {
      rtreeCheckAppendMsg(pCheck,"Node %lld is too small for cell count of %d (%d bytes)",iNode,
                          uVar7,(ulong)uVar5);
    }
    else {
      local_5c = (int)uVar9 + -1;
      local_48 = puVar6 + 8;
      local_58 = puVar6;
      local_40 = uVar9;
      for (uVar5 = 0; puVar6 = local_58, uVar5 != (uint)uVar7; uVar5 = uVar5 + 1) {
        iVar4 = pCheck->nDim;
        iVar8 = (iVar4 * 8 + 8) * uVar5;
        lVar10 = (long)(iVar8 + 4);
        local_50 = readInt64((u8 *)(lVar10 + (long)local_58));
        local_38 = (u8 *)((long)puVar6 + lVar10 + 8);
        p = (u8 *)((long)iVar8 + (long)local_48);
        p_00 = local_68;
        for (uVar9 = 0; iNode_00 = local_50, (long)uVar9 < (long)iVar4; uVar9 = uVar9 + 1) {
          readCoord(p + -4,&c1);
          readCoord(p,&c2);
          RVar2 = c1;
          RVar1 = c2;
          if (pCheck->bInt == 0) {
            if (c2.f < c1.f) goto LAB_001af9bf;
          }
          else if (c2.i < c1.i) {
LAB_001af9bf:
            rtreeCheckAppendMsg(pCheck,"Dimension %d of cell %d on node %lld is corrupt",
                                uVar9 & 0xffffffff,(ulong)uVar5,iNode);
          }
          if (local_68 != (u8 *)0x0) {
            readCoord(p_00,&p1);
            readCoord(p_00 + 4,&p2);
            if (pCheck->bInt == 0) {
              if ((RVar2.f < p1.f) || (p2.f < RVar1.f)) goto LAB_001afa61;
            }
            else if ((RVar2.i < p1.i) || (p2.i < RVar1.i)) {
LAB_001afa61:
              rtreeCheckAppendMsg(pCheck,
                                  "Dimension %d of cell %d on node %lld is corrupt relative to parent"
                                  ,uVar9 & 0xffffffff,(ulong)uVar5,iNode);
            }
          }
          iVar4 = pCheck->nDim;
          p_00 = p_00 + 8;
          p = p + 8;
        }
        if ((int)local_40 < 1) {
          rtreeCheckMapping(pCheck,1,local_50,iNode);
          pCheck->nLeaf = pCheck->nLeaf + 1;
        }
        else {
          rtreeCheckMapping(pCheck,0,local_50,iNode);
          rtreeCheckNode(pCheck,local_5c,local_38,iNode_00);
          pCheck->nNonLeaf = pCheck->nNonLeaf + 1;
        }
        uVar7 = (ulong)(uint)uVar3;
      }
    }
  }
  sqlite3_free(puVar6);
  return;
}

Assistant:

static void rtreeCheckNode(
  RtreeCheck *pCheck,
  int iDepth,                     /* Depth of iNode (0==leaf) */
  u8 *aParent,                    /* Buffer containing parent coords */
  i64 iNode                       /* Node to check */
){
  u8 *aNode = 0;
  int nNode = 0;

  assert( iNode==1 || aParent!=0 );
  assert( pCheck->nDim>0 );

  aNode = rtreeCheckGetNode(pCheck, iNode, &nNode);
  if( aNode ){
    if( nNode<4 ){
      rtreeCheckAppendMsg(pCheck, 
          "Node %lld is too small (%d bytes)", iNode, nNode
      );
    }else{
      int nCell;                  /* Number of cells on page */
      int i;                      /* Used to iterate through cells */
      if( aParent==0 ){
        iDepth = readInt16(aNode);
        if( iDepth>RTREE_MAX_DEPTH ){
          rtreeCheckAppendMsg(pCheck, "Rtree depth out of range (%d)", iDepth);
          sqlite3_free(aNode);
          return;
        }
      }
      nCell = readInt16(&aNode[2]);
      if( (4 + nCell*(8 + pCheck->nDim*2*4))>nNode ){
        rtreeCheckAppendMsg(pCheck, 
            "Node %lld is too small for cell count of %d (%d bytes)", 
            iNode, nCell, nNode
        );
      }else{
        for(i=0; i<nCell; i++){
          u8 *pCell = &aNode[4 + i*(8 + pCheck->nDim*2*4)];
          i64 iVal = readInt64(pCell);
          rtreeCheckCellCoord(pCheck, iNode, i, &pCell[8], aParent);

          if( iDepth>0 ){
            rtreeCheckMapping(pCheck, 0, iVal, iNode);
            rtreeCheckNode(pCheck, iDepth-1, &pCell[8], iVal);
            pCheck->nNonLeaf++;
          }else{
            rtreeCheckMapping(pCheck, 1, iVal, iNode);
            pCheck->nLeaf++;
          }
        }
      }
    }
    sqlite3_free(aNode);
  }
}